

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::
callable_impl<void,_async_unit_test::binder>::callable_impl
          (callable_impl<void,_async_unit_test::binder> *this,binder *f)

{
  callable<void_(cppcms::http::context::completion_type)>::callable(&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__callable_impl_0010d9a0;
  async_unit_test::binder::binder(&this->func,f);
  return;
}

Assistant:

callable_impl(F f) : func(f){}